

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  pointer pSVar6;
  pointer ppVar7;
  pointer pCVar8;
  ostream *poVar9;
  ulong uVar10;
  mapped_type *this;
  byte local_7aa;
  anon_class_8_1_00c01040 aStack_738;
  bool map_set;
  function<void_(const_HawkTracer::parser::Event_&)> local_730;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  local_710;
  iterator converter;
  string out_file;
  unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_> local_6c0
  ;
  ProtocolReader local_6b8 [8];
  ProtocolReader reader;
  KlassRegister local_620 [8];
  KlassRegister klass_register;
  bool is_stream_continuous;
  unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_> stream;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  string local_560 [8];
  string map_files;
  allocator local_539;
  string local_538 [39];
  allocator local_511;
  string local_510 [32];
  string local_4f0 [8];
  string source;
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [32];
  string local_480 [8];
  string output_path;
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  key_type local_410 [8];
  string format;
  allocator local_3e9;
  string local_3e8 [39];
  allocator local_3c1;
  string local_3c0 [32];
  OptionInfo local_3a0;
  allocator local_371;
  string local_370 [39];
  allocator local_349;
  string local_348 [32];
  OptionInfo local_328;
  allocator local_2f9;
  string local_2f8 [39];
  allocator local_2d1;
  string local_2d0 [32];
  OptionInfo local_2b0;
  allocator local_281;
  string local_280 [39];
  allocator local_259;
  string local_258 [32];
  OptionInfo local_238;
  allocator local_209;
  string local_208 [32];
  undefined1 local_1e8 [64];
  OptionInfo local_1a8;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [32];
  CommandLineParser local_108 [8];
  CommandLineParser parser;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  formats;
  char **argv_local;
  int argc_local;
  
  formats._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
         *)local_48);
  init_supported_formats
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
              *)local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"--",&local_129);
  pcVar1 = *(char **)formats._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,pcVar1,&local_151);
  HawkTracer::ClientUtils::CommandLineParser::CommandLineParser(local_108,local_128,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"format",&local_179);
  supported_formats((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                     *)local_1e8);
  std::operator+(local_1e8 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Output format. Supported formats: ");
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::OptionInfo
            (&local_1a8,false,false,(string *)(local_1e8 + 0x20));
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_108,local_178,&local_1a8);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::~OptionInfo(&local_1a8);
  std::__cxx11::string::~string((string *)(local_1e8 + 0x20));
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"output",&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"Output file",&local_259);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::OptionInfo
            (&local_238,false,false,(string *)local_258);
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_108,local_208,&local_238);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::~OptionInfo(&local_238);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,"source",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,"Data source description (either filename, or server address)",&local_2d1);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::OptionInfo
            (&local_2b0,false,true,(string *)local_2d0);
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_108,local_280,&local_2b0);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::~OptionInfo(&local_2b0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f8,"map",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"Comma-separated list of map files",&local_349);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::OptionInfo
            (&local_328,false,false,(string *)local_348);
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_108,local_2f8,&local_328);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::~OptionInfo(&local_328);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"help",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c0,"Print this help",&local_3c1);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::OptionInfo
            (&local_3a0,true,false,(string *)local_3c0);
  HawkTracer::ClientUtils::CommandLineParser::register_option(local_108,local_370,&local_3a0);
  HawkTracer::ClientUtils::CommandLineParser::OptionInfo::~OptionInfo(&local_3a0);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  bVar2 = HawkTracer::ClientUtils::CommandLineParser::parse
                    ((int)local_108,(char **)(ulong)(uint)argc);
  local_7aa = 1;
  if ((bVar2 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"help",&local_3e9);
    local_7aa = HawkTracer::ClientUtils::CommandLineParser::has_value((string *)local_108);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  }
  if ((local_7aa & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"format",&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,"chrome-tracing",&local_459);
    HawkTracer::ClientUtils::CommandLineParser::get_value(local_410,local_108,local_430,local_458);
    std::__cxx11::string::~string(local_458);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    std::__cxx11::string::~string(local_430);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a0,"output",&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4c8,"hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace",&local_4c9);
    HawkTracer::ClientUtils::CommandLineParser::get_value(local_480,local_108,local_4a0,local_4c8);
    std::__cxx11::string::~string(local_4c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
    std::__cxx11::string::~string(local_4a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_510,"source",&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_538,"",&local_539);
    HawkTracer::ClientUtils::CommandLineParser::get_value(local_4f0,local_108,local_510,local_538);
    std::__cxx11::string::~string(local_538);
    std::allocator<char>::~allocator((allocator<char> *)&local_539);
    std::__cxx11::string::~string(local_510);
    std::allocator<char>::~allocator((allocator<char> *)&local_511);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_580,"map",&local_581);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_5a8,"",
               (allocator *)
               ((long)&stream._M_t.
                       super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
                       .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl + 7)
              );
    HawkTracer::ClientUtils::CommandLineParser::get_value(local_560,local_108,local_580,local_5a8);
    std::__cxx11::string::~string(local_5a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&stream._M_t.
                       super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
                       .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl + 7)
              );
    std::__cxx11::string::~string(local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    HawkTracer::ClientUtils::make_stream_from_string((string *)&stack0xfffffffffffffa48);
    bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stack0xfffffffffffffa48);
    if (bVar3) {
      pSVar6 = std::
               unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
               ::operator->((unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                             *)&stack0xfffffffffffffa48);
      bVar2 = (**(code **)(*(long *)pSVar6 + 0x30))();
      HawkTracer::parser::KlassRegister::KlassRegister(local_620);
      std::unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
      ::unique_ptr(&local_6c0,
                   (unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                    *)&stack0xfffffffffffffa48);
      HawkTracer::parser::ProtocolReader::ProtocolReader(local_6b8,local_620,&local_6c0,1);
      std::unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
      ::~unique_ptr(&local_6c0);
      std::__cxx11::string::c_str();
      create_output_path_abi_cxx11_((char *)&converter);
      local_710._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                           *)local_48,local_410);
      local_710._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                  *)local_48);
      bVar3 = std::operator==((_Self *)&local_710._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (_Self *)&local_710._M_t._M_impl.super__Rb_tree_header._M_header.
                                        _M_right);
      if (bVar3) {
        poVar9 = std::operator<<((ostream *)&std::cerr,"Unknown format: ");
        poVar9 = std::operator<<(poVar9,(string *)local_410);
        poVar9 = std::operator<<(poVar9,". Supported formats are: ");
        supported_formats(&local_710);
        poVar9 = std::operator<<(poVar9,(string *)&local_710);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&local_710);
        argv_local._4_4_ = 1;
      }
      else {
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>
                               *)&local_710._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pCVar8 = std::
                 unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
                 ::operator->(&ppVar7->second);
        uVar5 = (*pCVar8->_vptr_Converter[2])(pCVar8,&converter);
        if ((uVar5 & 1) == 0) {
          poVar9 = std::operator<<((ostream *)&std::cerr,"Can\'t open output file");
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
        }
        else {
          aStack_738.converter =
               (iterator *)&local_710._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::function<void(HawkTracer::parser::Event_const&)>::function<main::__0,void>
                    ((function<void(HawkTracer::parser::Event_const&)> *)&local_730,
                     &stack0xfffffffffffff8c8);
          HawkTracer::parser::ProtocolReader::register_events_listener(local_6b8,&local_730);
          std::function<void_(const_HawkTracer::parser::Event_&)>::~function(&local_730);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            this = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
                                 *)local_48,local_410);
            pCVar8 = std::
                     unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
                     ::operator->(this);
            bVar3 = HawkTracer::client::Converter::set_tracepoint_map(pCVar8,local_560);
            if (!bVar3) {
              poVar9 = std::operator<<((ostream *)&std::cerr,"Map could not be set");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            }
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cerr,
                                     "map not specified... profiler will use numbers instead of human-readable names"
                                    );
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          }
          poVar9 = std::operator<<((ostream *)&std::cout,"Output will be written to a file: ");
          poVar9 = std::operator<<(poVar9,(string *)&converter);
          std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
          bVar4 = HawkTracer::parser::ProtocolReader::start();
          if ((bVar4 & 1) == 0) {
            poVar9 = std::operator<<((ostream *)&std::cerr,"Error on starting the reader!!!");
            std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 1;
          }
          else {
            if ((bVar2 & 1) == 0) {
              poVar9 = std::operator<<((ostream *)&std::cout,"Processing the file...");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
            }
            else {
              poVar9 = std::operator<<((ostream *)&std::cout,"Hit [Enter] to finish the trace...");
              std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
              getchar();
              HawkTracer::parser::ProtocolReader::stop();
            }
            HawkTracer::parser::ProtocolReader::wait_for_complete();
            HawkTracer::parser::ProtocolReader::stop();
            ppVar7 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>
                                   *)&local_710._M_t._M_impl.super__Rb_tree_header._M_node_count);
            pCVar8 = std::
                     unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>
                     ::operator->(&ppVar7->second);
            (*pCVar8->_vptr_Converter[4])();
            argv_local._4_4_ = 0;
          }
        }
      }
      std::__cxx11::string::~string((string *)&converter);
      HawkTracer::parser::ProtocolReader::~ProtocolReader(local_6b8);
      HawkTracer::parser::KlassRegister::~KlassRegister(local_620);
    }
    else {
      argv_local._4_4_ = 1;
    }
    std::unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>::
    ~unique_ptr((unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
                 *)&stack0xfffffffffffffa48);
    std::__cxx11::string::~string((string *)local_560);
    std::__cxx11::string::~string(local_4f0);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string((string *)local_410);
  }
  else {
    HawkTracer::ClientUtils::CommandLineParser::print_help((ostream *)local_108);
    argv_local._4_4_ = 1;
  }
  HawkTracer::ClientUtils::CommandLineParser::~CommandLineParser(local_108);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<HawkTracer::client::Converter,_std::default_delete<HawkTracer::client::Converter>_>_>_>_>
          *)local_48);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    std::map<std::string, std::unique_ptr<client::Converter>> formats;

    init_supported_formats(formats);

    CommandLineParser parser("--", argv[0]);
    parser.register_option("format", CommandLineParser::OptionInfo(false, false, "Output format. Supported formats: " + supported_formats(formats)));
    parser.register_option("output", CommandLineParser::OptionInfo(false, false, "Output file"));
    parser.register_option("source", CommandLineParser::OptionInfo(false, true, "Data source description (either filename, or server address)"));
    parser.register_option("map", CommandLineParser::OptionInfo(false, false, "Comma-separated list of map files"));
    parser.register_option("help", CommandLineParser::OptionInfo(true, false, "Print this help"));

    if (!parser.parse(argc, argv) || parser.has_value("help"))
    {
        parser.print_help(std::cerr);
        return 1;
    }

    std::string format = parser.get_value("format", "chrome-tracing");
    std::string output_path = parser.get_value("output", "hawktracer-trace-%d-%m-%Y-%H_%M_%S.httrace");
    std::string source = parser.get_value("source", "");
    std::string map_files = parser.get_value("map", "");

    std::unique_ptr<parser::Stream> stream = ClientUtils::make_stream_from_string(source);
    if (!stream)
    {
        return 1;
    }

    bool is_stream_continuous = stream->is_continuous();

    parser::KlassRegister klass_register;
    parser::ProtocolReader reader(&klass_register, std::move(stream), true);
    std::string out_file = create_output_path(output_path.c_str());

    auto converter = formats.find(format);
    if (converter == formats.end())
    {
        std::cerr << "Unknown format: " << format << ". Supported formats are: " << supported_formats(formats) << std::endl;
        return 1;
    }
    if (converter->second->init(out_file))
    {
        reader.register_events_listener([&converter] (const parser::Event& event) { converter->second->process_event(event); });
    }
    else
    {
        std::cerr << "Can't open output file" << std::endl;
        return 1;
    }

    if (map_files.empty())
    {
        std::cerr << "map not specified... profiler will use numbers instead of human-readable names" << std::endl;
    }
    else
    {
        bool map_set = formats[format]->set_tracepoint_map(map_files);
        if (!map_set)
        {
            std::cerr << "Map could not be set" << std::endl;
        }
    }

    std::cout << "Output will be written to a file: " << out_file << std::endl;

    if (!reader.start())
    {
        std::cerr << "Error on starting the reader!!!" << std::endl;
        return 1;
    }

    if (is_stream_continuous)
    {
        std::cout << "Hit [Enter] to finish the trace..." << std::endl;
        getchar();
        reader.stop();
    }
    else
    {
        std::cout << "Processing the file..." << std::endl;
    }

    reader.wait_for_complete();
    reader.stop();
    converter->second->stop();

    return 0;
}